

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dto.h
# Opt level: O0

string * dto::pretty_payload(string *__return_storage_ptr__,string *pld)

{
  ulong uVar1;
  char local_4a [2];
  char *local_48;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  undefined1 local_38 [8];
  string short_pld;
  string *pld_local;
  
  short_pld.field_2._8_8_ = pld;
  std::__cxx11::string::substr((ulong)local_38,(ulong)pld);
  local_40._M_current = (char *)std::__cxx11::string::begin();
  local_48 = (char *)std::__cxx11::string::end();
  local_4a[1] = 10;
  local_4a[0] = '|';
  std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
            (local_40,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       )local_48,local_4a + 1,local_4a);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::operator+(__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                   "...");
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_38);
  }
  std::__cxx11::string::~string((string *)local_38);
  return __return_storage_ptr__;
}

Assistant:

inline std::string pretty_payload(const std::string &pld) {
  std::string short_pld = pld.substr(0, 20);
  std::replace(short_pld.begin(), short_pld.end(), '\n', '|');
  return short_pld.empty() ? short_pld : short_pld + "...";
}